

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::FillCacheManagerFromUI(cmCursesMainForm *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  __type _Var3;
  int iVar4;
  CacheEntryType type;
  char *pcVar5;
  undefined4 extraout_var;
  long lVar6;
  cmState *pcVar7;
  allocator local_f9;
  string fixedNewValue;
  string fixedOldValue;
  string oldValue;
  string newValue;
  string local_70;
  string cacheKey;
  
  ppcVar1 = (this->Entries->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppcVar2 = (this->Entries->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 0; (long)ppcVar1 - (long)ppcVar2 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    std::__cxx11::string::string
              ((string *)&cacheKey,
               (string *)
               &(this->Entries->
                super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar6]->Key);
    pcVar5 = cmState::GetCacheEntryValue(this->CMakeInstance->State,&cacheKey);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string((string *)&oldValue,pcVar5,(allocator *)&newValue);
      iVar4 = (*(this->Entries->
                super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar6]->Entry->_vptr_cmCursesWidget[5])()
      ;
      std::__cxx11::string::string
                ((string *)&newValue,(char *)CONCAT44(extraout_var,iVar4),
                 (allocator *)&fixedOldValue);
      fixedOldValue._M_dataplus._M_p = (pointer)&fixedOldValue.field_2;
      fixedOldValue._M_string_length = 0;
      fixedNewValue._M_dataplus._M_p = (pointer)&fixedNewValue.field_2;
      fixedNewValue._M_string_length = 0;
      fixedOldValue.field_2._M_local_buf[0] = '\0';
      fixedNewValue.field_2._M_local_buf[0] = '\0';
      pcVar7 = this->CMakeInstance->State;
      type = cmState::GetCacheEntryType(pcVar7,&cacheKey);
      FixValue((cmCursesMainForm *)pcVar7,type,&oldValue,&fixedOldValue);
      FixValue((cmCursesMainForm *)pcVar7,type,&newValue,&fixedNewValue);
      _Var3 = std::operator==(&fixedOldValue,&fixedNewValue);
      if (!_Var3) {
        pcVar7 = this->CMakeInstance->State;
        std::__cxx11::string::string((string *)&local_70,"MODIFIED",&local_f9);
        cmState::SetCacheEntryBoolProperty(pcVar7,&cacheKey,&local_70,true);
        std::__cxx11::string::~string((string *)&local_70);
        cmState::SetCacheEntryValue(this->CMakeInstance->State,&cacheKey,&fixedNewValue);
      }
      std::__cxx11::string::~string((string *)&fixedNewValue);
      std::__cxx11::string::~string((string *)&fixedOldValue);
      std::__cxx11::string::~string((string *)&newValue);
      std::__cxx11::string::~string((string *)&oldValue);
    }
    std::__cxx11::string::~string((string *)&cacheKey);
  }
  return;
}

Assistant:

void cmCursesMainForm::FillCacheManagerFromUI()
{
  size_t size = this->Entries->size();
  for(size_t i=0; i < size; i++)
    {
    std::string cacheKey = (*this->Entries)[i]->Key;
      const char* existingValue = this->CMakeInstance->GetState()
        ->GetCacheEntryValue(cacheKey);
    if (existingValue)
      {
      std::string oldValue = existingValue;
      std::string newValue = (*this->Entries)[i]->Entry->GetValue();
      std::string fixedOldValue;
      std::string fixedNewValue;
      cmState::CacheEntryType t =
          this->CMakeInstance->GetState()
              ->GetCacheEntryType(cacheKey);
      this->FixValue(t, oldValue, fixedOldValue);
      this->FixValue(t, newValue, fixedNewValue);

      if(!(fixedOldValue == fixedNewValue))
        {
        // The user has changed the value.  Mark it as modified.
        this->CMakeInstance->GetState()
            ->SetCacheEntryBoolProperty(cacheKey, "MODIFIED", true);
        this->CMakeInstance->GetState()
            ->SetCacheEntryValue(cacheKey, fixedNewValue);
        }
      }
    }
}